

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O3

Vec_Str_t *
Gia_AigerWriteIntoMemoryStrPart
          (Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  Vec_Str_t *p_00;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int i;
  long lVar13;
  int iVar14;
  long lVar15;
  
  pGVar4 = p->pObjs;
  pGVar4->Value = 0;
  iVar14 = vCis->nSize;
  if ((long)iVar14 < 1) {
    iVar14 = 1;
  }
  else {
    piVar5 = vCis->pArray;
    lVar15 = 0;
    do {
      lVar13 = (long)piVar5[lVar15];
      if ((lVar13 < 0) || (p->nObjs <= piVar5[lVar15])) goto LAB_001d2b3d;
      if ((~*(uint *)(pGVar4 + lVar13) & 0x9fffffff) != 0) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x3f3,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      lVar15 = lVar15 + 1;
      pGVar4[lVar13].Value = (uint)lVar15;
    } while (iVar14 != lVar15);
    iVar14 = (uint)lVar15 + 1;
  }
  iVar2 = vAnds->nSize;
  if ((long)iVar2 < 1) {
    iVar12 = p->nObjs;
  }
  else {
    piVar5 = vAnds->pArray;
    lVar15 = 0;
    do {
      lVar13 = (long)piVar5[lVar15];
      if ((lVar13 < 0) || (iVar12 = p->nObjs, iVar12 <= piVar5[lVar15])) goto LAB_001d2b3d;
      if (((int)(uint)*(undefined8 *)(pGVar4 + lVar13) < 0) ||
         (((uint)*(undefined8 *)(pGVar4 + lVar13) & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x3f8,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      pGVar4[lVar13].Value = iVar14 + (int)lVar15;
      lVar15 = lVar15 + 1;
    } while (iVar2 != lVar15);
  }
  p_00 = (Vec_Str_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar12 * 3 - 1U) {
    iVar14 = iVar12 * 3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = (char *)malloc((long)iVar14);
  }
  p_00->pArray = pcVar9;
  lVar15 = 0;
  do {
    cVar1 = "aig "[lVar15];
    uVar10 = p_00->nSize;
    if (uVar10 == p_00->nCap) {
      if ((int)uVar10 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar7 = (ulong)uVar10 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar7);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar7);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar7;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    iVar14 = p_00->nSize;
    p_00->nSize = iVar14 + 1;
    pcVar9[iVar14] = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  Vec_StrPrintNum(p_00,vAnds->nSize + vCis->nSize);
  uVar10 = p_00->nSize;
  if (uVar10 == p_00->nCap) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar7 = (ulong)uVar10 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar7);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar7);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar7;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar14 = p_00->nSize;
  p_00->nSize = iVar14 + 1;
  pcVar9[iVar14] = ' ';
  Vec_StrPrintNum(p_00,vCis->nSize - nRegs);
  uVar10 = p_00->nSize;
  if (uVar10 == p_00->nCap) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar7 = (ulong)uVar10 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar7);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar7);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar7;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar14 = p_00->nSize;
  p_00->nSize = iVar14 + 1;
  pcVar9[iVar14] = ' ';
  Vec_StrPrintNum(p_00,nRegs);
  uVar10 = p_00->nSize;
  if (uVar10 == p_00->nCap) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar7 = (ulong)uVar10 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar7);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar7);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar7;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar14 = p_00->nSize;
  p_00->nSize = iVar14 + 1;
  pcVar9[iVar14] = ' ';
  Vec_StrPrintNum(p_00,vCos->nSize - nRegs);
  uVar10 = p_00->nSize;
  if (uVar10 == p_00->nCap) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar7 = (ulong)uVar10 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar7);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar7);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar7;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar14 = p_00->nSize;
  p_00->nSize = iVar14 + 1;
  pcVar9[iVar14] = ' ';
  Vec_StrPrintNum(p_00,vAnds->nSize);
  uVar10 = p_00->nSize;
  if (uVar10 == p_00->nCap) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar7 = (ulong)uVar10 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar7);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar7);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar7;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar14 = p_00->nSize;
  p_00->nSize = iVar14 + 1;
  pcVar9[iVar14] = '\n';
  iVar14 = vCos->nSize;
  if (0 < iVar14) {
    lVar15 = 0;
    do {
      iVar2 = vCos->pArray[lVar15];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001d2b3d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar2;
      uVar10 = (uint)*(undefined8 *)pGVar4;
      if ((-1 < (int)uVar10) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x40d,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if (iVar14 - nRegs <= lVar15) {
        uVar3 = pGVar4[-(ulong)(uVar10 & 0x1fffffff)].Value;
        if ((int)uVar3 < 0) goto LAB_001d2b5c;
        Vec_StrPrintNum(p_00,(uVar10 >> 0x1d & 1) + uVar3 * 2);
        uVar10 = p_00->nSize;
        if (uVar10 == p_00->nCap) {
          if ((int)uVar10 < 0x10) {
            if (p_00->pArray == (char *)0x0) {
              pcVar9 = (char *)malloc(0x10);
            }
            else {
              pcVar9 = (char *)realloc(p_00->pArray,0x10);
            }
            p_00->pArray = pcVar9;
            p_00->nCap = 0x10;
          }
          else {
            sVar7 = (ulong)uVar10 * 2;
            if (p_00->pArray == (char *)0x0) {
              pcVar9 = (char *)malloc(sVar7);
            }
            else {
              pcVar9 = (char *)realloc(p_00->pArray,sVar7);
            }
            p_00->pArray = pcVar9;
            p_00->nCap = (int)sVar7;
          }
        }
        else {
          pcVar9 = p_00->pArray;
        }
        iVar14 = p_00->nSize;
        p_00->nSize = iVar14 + 1;
        pcVar9[iVar14] = '\n';
        iVar14 = vCos->nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar14);
    if (0 < iVar14) {
      lVar15 = 0;
      do {
        iVar2 = vCos->pArray[lVar15];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001d2b3d;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar2;
        uVar10 = (uint)*(undefined8 *)pGVar4;
        if ((-1 < (int)uVar10) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                        ,0x417,
                        "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (lVar15 < iVar14 - nRegs) {
          uVar3 = pGVar4[-(ulong)(uVar10 & 0x1fffffff)].Value;
          if ((int)uVar3 < 0) goto LAB_001d2b5c;
          Vec_StrPrintNum(p_00,(uVar10 >> 0x1d & 1) + uVar3 * 2);
          uVar10 = p_00->nSize;
          if (uVar10 == p_00->nCap) {
            if ((int)uVar10 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(p_00->pArray,0x10);
              }
              p_00->pArray = pcVar9;
              p_00->nCap = 0x10;
            }
            else {
              sVar7 = (ulong)uVar10 * 2;
              if (p_00->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar7);
              }
              else {
                pcVar9 = (char *)realloc(p_00->pArray,sVar7);
              }
              p_00->pArray = pcVar9;
              p_00->nCap = (int)sVar7;
            }
          }
          else {
            pcVar9 = p_00->pArray;
          }
          iVar14 = p_00->nSize;
          p_00->nSize = iVar14 + 1;
          pcVar9[iVar14] = '\n';
          iVar14 = vCos->nSize;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar14);
    }
  }
  if (0 < vAnds->nSize) {
    lVar15 = 0;
    do {
      iVar14 = vAnds->pArray[lVar15];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_001d2b3d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar14;
      if ((int)pGVar4->Value < 0) {
LAB_001d2b5c:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar6 = *(ulong *)pGVar4;
      if ((int)pGVar4[-(ulong)((uint)uVar6 & 0x1fffffff)].Value < 0) goto LAB_001d2b5c;
      uVar10 = (uint)(uVar6 >> 0x20);
      if ((int)pGVar4[-(ulong)(uVar10 & 0x1fffffff)].Value < 0) goto LAB_001d2b5c;
      uVar3 = ((uint)(uVar6 >> 0x1d) & 1) + pGVar4[-(ulong)((uint)uVar6 & 0x1fffffff)].Value * 2;
      uVar10 = (uVar10 >> 0x1d & 1) + pGVar4[-(ulong)(uVar10 & 0x1fffffff)].Value * 2;
      if (uVar3 == uVar10) {
        __assert_fail("uLit0 != uLit1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                      ,0x425,
                      "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      uVar8 = uVar10;
      if (uVar10 < uVar3) {
        uVar8 = uVar3;
      }
      Gia_AigerWriteUnsigned(p_00,pGVar4->Value * 2 - uVar8);
      lVar11 = (ulong)uVar3 - (ulong)uVar10;
      lVar13 = -lVar11;
      if (0 < lVar11) {
        lVar13 = lVar11;
      }
      Gia_AigerWriteUnsigned(p_00,(uint)lVar13);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vAnds->nSize);
  }
  uVar10 = p_00->nSize;
  if (uVar10 == p_00->nCap) {
    if ((int)uVar10 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar7 = (ulong)uVar10 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar7);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar7);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar7;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar14 = p_00->nSize;
  p_00->nSize = iVar14 + 1;
  pcVar9[iVar14] = 'c';
  return p_00;
}

Assistant:

Vec_Str_t * Gia_AigerWriteIntoMemoryStrPart( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Vec_Str_t * vBuffer;
    Gia_Obj_t * pObj;
    int nNodes = 0, i, uLit, uLit0, uLit1; 
    // set the node numbers to be used in the output file
    Gia_ManConst0(p)->Value = nNodes++;
    Gia_ManForEachObjVec( vCis, p, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) );
        pObj->Value = nNodes++;
    }
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        pObj->Value = nNodes++;
    }

    // write the header "M I L O A" where M = I + L + A
    vBuffer = Vec_StrAlloc( 3*Gia_ManObjNum(p) );
    Vec_StrPrintStr( vBuffer, "aig " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) + Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCos) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, "\n" );

    // write latch drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i < Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }
    // write output drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i >= Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }

    // write the nodes into the buffer
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        uLit  = Abc_Var2Lit( Gia_ObjValue(pObj), 0 );
        uLit0 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        uLit1 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin1(pObj)), Gia_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Gia_AigerWriteUnsigned( vBuffer, uLit  - uLit1 );
        Gia_AigerWriteUnsigned( vBuffer, uLit1 - uLit0 );
    }
    Vec_StrPrintStr( vBuffer, "c" );
    return vBuffer;
}